

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O2

class_<ki::protocol::dml::MessageManager> * __thiscall
pybind11::class_<ki::protocol::dml::MessageManager>::
def<ki::protocol::dml::Message*(ki::protocol::dml::MessageManager::*)(std::__cxx11::string_const&,unsigned_char)const,pybind11::arg,pybind11::arg,pybind11::return_value_policy>
          (class_<ki::protocol::dml::MessageManager> *this,char *name_,offset_in_Message_to_subr *f,
          arg *extra,arg *extra_1,return_value_policy *extra_2)

{
  offset_in_Message_to_subr f_00;
  name *extra_00;
  handle local_78;
  cpp_function cf;
  handle local_68;
  object local_60;
  obj_attr_accessor local_58;
  PyObject *local_38;
  
  f_00 = *f;
  extra_00 = (name *)f[1];
  local_78.m_ptr = (this->super_generic_type).super_object.super_handle.m_ptr;
  local_60.super_handle.m_ptr = (handle)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  local_58._0_8_ = name_;
  getattr((pybind11 *)&local_68,local_78,name_,(PyObject *)&_Py_NoneStruct);
  local_38 = local_68.m_ptr;
  cpp_function::
  cpp_function<ki::protocol::dml::Message*,ki::protocol::dml::MessageManager,std::__cxx11::string_const&,unsigned_char,pybind11::name,pybind11::is_method,pybind11::sibling,pybind11::arg,pybind11::arg,pybind11::return_value_policy>
            (&cf,f_00,extra_00,(is_method *)&local_58,(sibling *)&local_78,(arg *)&local_38,extra,
             (return_value_policy *)extra_1);
  object::~object((object *)&local_68);
  object::~object(&local_60);
  cpp_function::name((cpp_function *)&local_78);
  detail::object_api<pybind11::handle>::attr
            (&local_58,(object_api<pybind11::handle> *)this,local_78);
  detail::accessor<pybind11::detail::accessor_policies::obj_attr>::operator=(&local_58,&cf);
  detail::accessor<pybind11::detail::accessor_policies::obj_attr>::~accessor(&local_58);
  object::~object((object *)&local_78);
  object::~object((object *)&cf);
  return this;
}

Assistant:

class_ &def(const char *name_, Func&& f, const Extra&... extra) {
        cpp_function cf(method_adaptor<type>(std::forward<Func>(f)), name(name_), is_method(*this),
                        sibling(getattr(*this, name_, none())), extra...);
        attr(cf.name()) = cf;
        return *this;
    }